

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O0

HighsInt __thiscall
ProductFormUpdate::update(ProductFormUpdate *this,HVector *aq,HighsInt *pivot_row)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsInt iRow;
  HighsInt iX;
  double pivot;
  value_type_conflict2 *in_stack_ffffffffffffffa8;
  pointer *this_00;
  pointer *in_stack_ffffffffffffffb8;
  int local_2c;
  HighsInt local_4;
  
  if (*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish < 0x32) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)*in_RDX);
    if (1e-08 <= ABS(*pvVar2)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,
                 (value_type_conflict2 *)in_stack_ffffffffffffffb8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_RDI,(value_type_conflict1 *)in_stack_ffffffffffffffb8);
      for (local_2c = 0; local_2c < *(int *)(in_RSI + 4); local_2c = local_2c + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_2c);
        iVar1 = *pvVar3;
        if (iVar1 != *in_RDX) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_RDI,
                     (value_type_conflict2 *)in_stack_ffffffffffffffb8);
          in_stack_ffffffffffffffb8 =
               &in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar1);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_RDI,(value_type_conflict1 *)in_stack_ffffffffffffffb8);
        }
      }
      this_00 = &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)
                 &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,in_stack_ffffffffffffffa8);
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish =
           *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      local_4 = 0;
    }
    else {
      local_4 = 7;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

HighsInt ProductFormUpdate::update(HVector* aq, HighsInt* pivot_row) {
  assert(0 <= *pivot_row && *pivot_row < num_row_);
  if (update_count_ >= kProductFormMaxUpdates)
    return kRebuildReasonUpdateLimitReached;
  double pivot = aq->array[*pivot_row];
  if (fabs(pivot) < kProductFormPivotTolerance)
    return kRebuildReasonPossiblySingularBasis;
  pivot_index_.push_back(*pivot_row);
  pivot_value_.push_back(pivot);
  for (HighsInt iX = 0; iX < aq->count; iX++) {
    HighsInt iRow = aq->index[iX];
    if (iRow == *pivot_row) continue;
    index_.push_back(iRow);
    value_.push_back(aq->array[iRow]);
  }
  start_.push_back(index_.size());
  update_count_++;
  return kRebuildReasonNo;
}